

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* flatbuffers::(anonymous_namespace)::RustKeywords_abi_cxx11_(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e88;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c8;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_9c7;
  undefined1 local_9c6;
  allocator<char> local_9c5;
  allocator<char> local_9c4;
  allocator<char> local_9c3;
  allocator<char> local_9c2;
  allocator<char> local_9c1;
  allocator<char> local_9c0;
  allocator<char> local_9bf;
  allocator<char> local_9be;
  allocator<char> local_9bd;
  allocator<char> local_9bc;
  allocator<char> local_9bb;
  allocator<char> local_9ba;
  allocator<char> local_9b9;
  allocator<char> local_9b8;
  allocator<char> local_9b7;
  allocator<char> local_9b6;
  allocator<char> local_9b5;
  allocator<char> local_9b4;
  allocator<char> local_9b3;
  allocator<char> local_9b2;
  allocator<char> local_9b1;
  allocator<char> local_9b0;
  allocator<char> local_9af;
  allocator<char> local_9ae;
  allocator<char> local_9ad;
  allocator<char> local_9ac;
  allocator<char> local_9ab;
  allocator<char> local_9aa;
  allocator<char> local_9a9;
  allocator<char> local_9a8;
  allocator<char> local_9a7;
  allocator<char> local_9a6;
  allocator<char> local_9a5;
  allocator<char> local_9a4;
  allocator<char> local_9a3;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  allocator<char> local_9a0;
  allocator<char> local_99f;
  allocator<char> local_99e;
  allocator<char> local_99d;
  allocator<char> local_99c;
  allocator<char> local_99b;
  allocator<char> local_99a;
  allocator<char> local_999;
  allocator<char> local_998;
  allocator<char> local_997;
  allocator<char> local_996;
  allocator<char> local_995;
  allocator<char> local_994;
  allocator<char> local_993;
  allocator<char> local_992;
  allocator<char> local_991;
  allocator<char> local_990;
  allocator<char> local_98f;
  allocator<char> local_98e;
  allocator<char> local_98d;
  allocator<char> local_98c;
  allocator<char> local_98b;
  allocator<char> local_98a;
  allocator<char> local_989;
  allocator<char> local_988;
  allocator<char> local_987;
  allocator<char> local_986;
  allocator<char> local_985;
  allocator<char> local_984;
  allocator<char> local_983;
  allocator<char> local_982;
  allocator<char> local_981;
  allocator<char> local_980;
  allocator<char> local_97f;
  allocator<char> local_97e;
  allocator<char> local_97d [20];
  allocator<char> local_969;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type_conflict local_18;
  
  local_9c6 = 1;
  local_968 = &local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"as",&local_969);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_940,"break",local_97d);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_920;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_920,"const",&local_97e);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_900,"continue",&local_97f);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"crate",&local_980);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"else",&local_981);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"enum",&local_982);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_880,"extern",&local_983);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_860;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_860,"false",&local_984);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_840,"fn",&local_985);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"for",&local_986);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_800,"if",&local_987);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"impl",&local_988);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"in",&local_989);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"let",&local_98a);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_780,"loop",&local_98b);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_760,"match",&local_98c);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_740,"mod",&local_98d);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_720,"move",&local_98e);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_700,"mut",&local_98f);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"pub",&local_990);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"ref",&local_991);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"return",&local_992);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_680,"Self",&local_993);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_660,"self",&local_994);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_640,"static",&local_995);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_620,"struct",&local_996);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_600,"super",&local_997);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"trait",&local_998);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"true",&local_999);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"type",&local_99a);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_580,"unsafe",&local_99b);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_560,"use",&local_99c);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_540,"where",&local_99d);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_520,"while",&local_99e);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"abstract",&local_99f);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"alignof",&local_9a0);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"become",&local_9a1);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"box",&local_9a2);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_480,"do",&local_9a3);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"final",&local_9a4);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_440,"macro",&local_9a5);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_420,"offsetof",&local_9a6);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_400,"override",&local_9a7);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"priv",&local_9a8);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"proc",&local_9a9);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"pure",&local_9aa);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_380,"sizeof",&local_9ab);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_360,"typeof",&local_9ac);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"unsized",&local_9ad);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"virtual",&local_9ae);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_300,"yield",&local_9af);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"std",&local_9b0);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"usize",&local_9b1);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"isize",&local_9b2);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_280,"u8",&local_9b3);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_260,"i8",&local_9b4);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_240,"u16",&local_9b5);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"i16",&local_9b6);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"u32",&local_9b7);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"i32",&local_9b8);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"u64",&local_9b9);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"i64",&local_9ba);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"u128",&local_9bb);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"i128",&local_9bc);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"f32",&local_9bd);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"f64",&local_9be);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"follow",&local_9bf);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"push",&local_9c0);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"to_little_endian",&local_9c1);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"from_little_endian",&local_9c2);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"ENUM_MAX",&local_9c3);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"ENUM_MIN",&local_9c4);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"ENUM_VALUES",&local_9c5);
  local_9c6 = 0;
  local_20 = &local_960;
  local_18 = 0x4a;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_9c8);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_RDI,__l,&local_9c7,&local_9c8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_9c8);
  local_e88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_e88 = local_e88 + -1;
    std::__cxx11::string::~string((string *)local_e88);
  } while (local_e88 != &local_960);
  std::allocator<char>::~allocator(&local_9c5);
  std::allocator<char>::~allocator(&local_9c4);
  std::allocator<char>::~allocator(&local_9c3);
  std::allocator<char>::~allocator(&local_9c2);
  std::allocator<char>::~allocator(&local_9c1);
  std::allocator<char>::~allocator(&local_9c0);
  std::allocator<char>::~allocator(&local_9bf);
  std::allocator<char>::~allocator(&local_9be);
  std::allocator<char>::~allocator(&local_9bd);
  std::allocator<char>::~allocator(&local_9bc);
  std::allocator<char>::~allocator(&local_9bb);
  std::allocator<char>::~allocator(&local_9ba);
  std::allocator<char>::~allocator(&local_9b9);
  std::allocator<char>::~allocator(&local_9b8);
  std::allocator<char>::~allocator(&local_9b7);
  std::allocator<char>::~allocator(&local_9b6);
  std::allocator<char>::~allocator(&local_9b5);
  std::allocator<char>::~allocator(&local_9b4);
  std::allocator<char>::~allocator(&local_9b3);
  std::allocator<char>::~allocator(&local_9b2);
  std::allocator<char>::~allocator(&local_9b1);
  std::allocator<char>::~allocator(&local_9b0);
  std::allocator<char>::~allocator(&local_9af);
  std::allocator<char>::~allocator(&local_9ae);
  std::allocator<char>::~allocator(&local_9ad);
  std::allocator<char>::~allocator(&local_9ac);
  std::allocator<char>::~allocator(&local_9ab);
  std::allocator<char>::~allocator(&local_9aa);
  std::allocator<char>::~allocator(&local_9a9);
  std::allocator<char>::~allocator(&local_9a8);
  std::allocator<char>::~allocator(&local_9a7);
  std::allocator<char>::~allocator(&local_9a6);
  std::allocator<char>::~allocator(&local_9a5);
  std::allocator<char>::~allocator(&local_9a4);
  std::allocator<char>::~allocator(&local_9a3);
  std::allocator<char>::~allocator(&local_9a2);
  std::allocator<char>::~allocator(&local_9a1);
  std::allocator<char>::~allocator(&local_9a0);
  std::allocator<char>::~allocator(&local_99f);
  std::allocator<char>::~allocator(&local_99e);
  std::allocator<char>::~allocator(&local_99d);
  std::allocator<char>::~allocator(&local_99c);
  std::allocator<char>::~allocator(&local_99b);
  std::allocator<char>::~allocator(&local_99a);
  std::allocator<char>::~allocator(&local_999);
  std::allocator<char>::~allocator(&local_998);
  std::allocator<char>::~allocator(&local_997);
  std::allocator<char>::~allocator(&local_996);
  std::allocator<char>::~allocator(&local_995);
  std::allocator<char>::~allocator(&local_994);
  std::allocator<char>::~allocator(&local_993);
  std::allocator<char>::~allocator(&local_992);
  std::allocator<char>::~allocator(&local_991);
  std::allocator<char>::~allocator(&local_990);
  std::allocator<char>::~allocator(&local_98f);
  std::allocator<char>::~allocator(&local_98e);
  std::allocator<char>::~allocator(&local_98d);
  std::allocator<char>::~allocator(&local_98c);
  std::allocator<char>::~allocator(&local_98b);
  std::allocator<char>::~allocator(&local_98a);
  std::allocator<char>::~allocator(&local_989);
  std::allocator<char>::~allocator(&local_988);
  std::allocator<char>::~allocator(&local_987);
  std::allocator<char>::~allocator(&local_986);
  std::allocator<char>::~allocator(&local_985);
  std::allocator<char>::~allocator(&local_984);
  std::allocator<char>::~allocator(&local_983);
  std::allocator<char>::~allocator(&local_982);
  std::allocator<char>::~allocator(&local_981);
  std::allocator<char>::~allocator(&local_980);
  std::allocator<char>::~allocator(&local_97f);
  std::allocator<char>::~allocator(&local_97e);
  std::allocator<char>::~allocator(local_97d);
  std::allocator<char>::~allocator(&local_969);
  return in_RDI;
}

Assistant:

static std::set<std::string> RustKeywords() {
  return {
    // https://doc.rust-lang.org/book/second-edition/appendix-01-keywords.html
    "as",
    "break",
    "const",
    "continue",
    "crate",
    "else",
    "enum",
    "extern",
    "false",
    "fn",
    "for",
    "if",
    "impl",
    "in",
    "let",
    "loop",
    "match",
    "mod",
    "move",
    "mut",
    "pub",
    "ref",
    "return",
    "Self",
    "self",
    "static",
    "struct",
    "super",
    "trait",
    "true",
    "type",
    "unsafe",
    "use",
    "where",
    "while",
    // future possible keywords
    "abstract",
    "alignof",
    "become",
    "box",
    "do",
    "final",
    "macro",
    "offsetof",
    "override",
    "priv",
    "proc",
    "pure",
    "sizeof",
    "typeof",
    "unsized",
    "virtual",
    "yield",
    // other rust terms we should not use
    "std",
    "usize",
    "isize",
    "u8",
    "i8",
    "u16",
    "i16",
    "u32",
    "i32",
    "u64",
    "i64",
    "u128",
    "i128",
    "f32",
    "f64",
    // Terms that we use ourselves
    "follow",
    "push",
    "to_little_endian",
    "from_little_endian",
    "ENUM_MAX",
    "ENUM_MIN",
    "ENUM_VALUES",
  };
}